

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::Model::MergePartialFromCodedStream(Model *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  OneHotEncoder *value;
  TextClassifier *value_00;
  GLMClassifier *value_01;
  GLMRegressor *value_02;
  CategoricalMapping *value_03;
  Scaler *value_04;
  NonMaximumSuppression *value_05;
  DictVectorizer *value_06;
  Imputer *value_07;
  ArrayFeatureExtractor *value_08;
  FeatureVectorizer *value_09;
  Normalizer *value_10;
  Pipeline *value_11;
  PipelineRegressor *value_12;
  Gazetteer *value_13;
  KNearestNeighborsClassifier *value_14;
  ModelDescription *value_15;
  PipelineClassifier *value_16;
  BayesianProbitRegressor *value_17;
  NeuralNetwork *value_18;
  VisionFeaturePrint *value_19;
  TreeEnsembleClassifier *value_20;
  TreeEnsembleRegressor *value_21;
  SoundAnalysisPreprocessing *value_22;
  CustomModel *value_23;
  NeuralNetworkClassifier *value_24;
  WordTagger *value_25;
  LinkedModel *value_26;
  SupportVectorClassifier *value_27;
  NeuralNetworkRegressor *value_28;
  SupportVectorRegressor *value_29;
  Identity *value_30;
  WordEmbedding *value_31;
  ItemSimilarityRecommender *value_32;
  SerializedModel *value_33;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  
  do {
    pbVar3 = input->buffer_;
    uVar5 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar5 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar7, (~(uint)*pbVar1 & uVar7) < 0x80))
        goto LAB_0018a79c;
        uVar8 = (ulong)((uVar7 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar8 = uVar8 | 0x100000000;
    }
    else {
LAB_0018a79c:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x5dc2) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
switchD_0018a2b6_caseD_25d:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    }
    else {
      uVar7 = (uint)(uVar8 >> 3) & 0x1fffffff;
      cVar6 = (char)uVar8;
      switch(uVar7) {
      case 600:
        if (cVar6 != -0x3e) goto switchD_0018a2b6_caseD_25d;
        value = mutable_onehotencoder(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::OneHotEncoder>(input,value);
        break;
      case 0x259:
        if (cVar6 != -0x36) goto switchD_0018a2b6_caseD_25d;
        value_07 = mutable_imputer(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Imputer>(input,value_07);
        break;
      case 0x25a:
        if (cVar6 != -0x2e) goto switchD_0018a2b6_caseD_25d;
        value_09 = mutable_featurevectorizer(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::FeatureVectorizer>(input,value_09);
        break;
      case 0x25b:
        if (cVar6 != -0x26) goto switchD_0018a2b6_caseD_25d;
        value_06 = mutable_dictvectorizer(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::DictVectorizer>(input,value_06);
        break;
      case 0x25c:
        if (cVar6 != -0x1e) goto switchD_0018a2b6_caseD_25d;
        value_04 = mutable_scaler(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Scaler>(input,value_04);
        break;
      case 0x25d:
      case 0x260:
        goto switchD_0018a2b6_caseD_25d;
      case 0x25e:
        if (cVar6 != -0xe) goto switchD_0018a2b6_caseD_25d;
        value_03 = mutable_categoricalmapping(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::CategoricalMapping>(input,value_03);
        break;
      case 0x25f:
        if (cVar6 != -6) goto switchD_0018a2b6_caseD_25d;
        value_10 = mutable_normalizer(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Normalizer>(input,value_10);
        break;
      case 0x261:
        if (cVar6 != '\n') goto switchD_0018a2b6_caseD_25d;
        value_08 = mutable_arrayfeatureextractor(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::ArrayFeatureExtractor>(input,value_08);
        break;
      case 0x262:
        if (cVar6 != '\x12') goto switchD_0018a2b6_caseD_25d;
        value_05 = mutable_nonmaximumsuppression(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::NonMaximumSuppression>(input,value_05);
        break;
      default:
        switch(uVar7) {
        case 2000:
          if (cVar6 != -0x7e) goto switchD_0018a2b6_caseD_25d;
          value_00 = mutable_textclassifier(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::TextClassifier>
                            (input,value_00);
          break;
        case 0x7d1:
          if (cVar6 != -0x76) goto switchD_0018a2b6_caseD_25d;
          value_25 = mutable_wordtagger(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::WordTagger>
                            (input,value_25);
          break;
        case 0x7d2:
          if (cVar6 != -0x6e) goto switchD_0018a2b6_caseD_25d;
          value_19 = mutable_visionfeatureprint(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::VisionFeaturePrint>
                            (input,value_19);
          break;
        case 0x7d3:
          if (cVar6 != -0x66) goto switchD_0018a2b6_caseD_25d;
          value_22 = mutable_soundanalysispreprocessing(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing>
                            (input,value_22);
          break;
        case 0x7d4:
          if (cVar6 != -0x5e) goto switchD_0018a2b6_caseD_25d;
          value_13 = mutable_gazetteer(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::Gazetteer>
                            (input,value_13);
          break;
        case 0x7d5:
          if (cVar6 != -0x56) goto switchD_0018a2b6_caseD_25d;
          value_31 = mutable_wordembedding(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::CoreMLModels::WordEmbedding>
                            (input,value_31);
          break;
        default:
          switch(uVar7) {
          case 300:
            if (cVar6 != 'b') goto switchD_0018a2b6_caseD_25d;
            value_02 = mutable_glmregressor(this);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::GLMRegressor>(input,value_02);
            break;
          case 0x12d:
            if (cVar6 != 'j') goto switchD_0018a2b6_caseD_25d;
            value_29 = mutable_supportvectorregressor(this);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::SupportVectorRegressor>
                              (input,value_29);
            break;
          case 0x12e:
            if (cVar6 != 'r') goto switchD_0018a2b6_caseD_25d;
            value_21 = mutable_treeensembleregressor(this);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::TreeEnsembleRegressor>
                              (input,value_21);
            break;
          case 0x12f:
            if (cVar6 != 'z') goto switchD_0018a2b6_caseD_25d;
            value_28 = mutable_neuralnetworkregressor(this);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::NeuralNetworkRegressor>
                              (input,value_28);
            break;
          case 0x130:
            if (cVar6 != -0x7e) goto switchD_0018a2b6_caseD_25d;
            value_17 = mutable_bayesianprobitregressor(this);
            bVar4 = google::protobuf::internal::WireFormatLite::
                    ReadMessageNoVirtual<CoreML::Specification::BayesianProbitRegressor>
                              (input,value_17);
            break;
          default:
            switch(uVar7) {
            case 400:
              if (cVar6 != -0x7e) goto switchD_0018a2b6_caseD_25d;
              value_01 = mutable_glmclassifier(this);
              bVar4 = google::protobuf::internal::WireFormatLite::
                      ReadMessageNoVirtual<CoreML::Specification::GLMClassifier>(input,value_01);
              break;
            case 0x191:
              if (cVar6 != -0x76) goto switchD_0018a2b6_caseD_25d;
              value_27 = mutable_supportvectorclassifier(this);
              bVar4 = google::protobuf::internal::WireFormatLite::
                      ReadMessageNoVirtual<CoreML::Specification::SupportVectorClassifier>
                                (input,value_27);
              break;
            case 0x192:
              if (cVar6 != -0x6e) goto switchD_0018a2b6_caseD_25d;
              value_20 = mutable_treeensembleclassifier(this);
              bVar4 = google::protobuf::internal::WireFormatLite::
                      ReadMessageNoVirtual<CoreML::Specification::TreeEnsembleClassifier>
                                (input,value_20);
              break;
            case 0x193:
              if (cVar6 != -0x66) goto switchD_0018a2b6_caseD_25d;
              value_24 = mutable_neuralnetworkclassifier(this);
              bVar4 = google::protobuf::internal::WireFormatLite::
                      ReadMessageNoVirtual<CoreML::Specification::NeuralNetworkClassifier>
                                (input,value_24);
              break;
            case 0x194:
              if (cVar6 != -0x5e) goto switchD_0018a2b6_caseD_25d;
              value_14 = mutable_knearestneighborsclassifier(this);
              bVar4 = google::protobuf::internal::WireFormatLite::
                      ReadMessageNoVirtual<CoreML::Specification::KNearestNeighborsClassifier>
                                (input,value_14);
              break;
            default:
              if (uVar7 == 3000) {
                if (cVar6 != -0x3e) goto switchD_0018a2b6_caseD_25d;
                value_33 = mutable_serializedmodel(this);
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadMessageNoVirtual<CoreML::Specification::SerializedModel>(input,value_33)
                ;
              }
              else if (uVar7 == 2) {
                if (cVar6 != '\x12') goto switchD_0018a2b6_caseD_25d;
                value_15 = mutable_description(this);
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadMessageNoVirtual<CoreML::Specification::ModelDescription>
                                  (input,value_15);
              }
              else if (uVar7 == 10) {
                if (cVar6 != 'P') goto switchD_0018a2b6_caseD_25d;
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                                  (input,&this->isupdatable_);
              }
              else if (uVar7 == 200) {
                if (cVar6 != 'B') goto switchD_0018a2b6_caseD_25d;
                value_16 = mutable_pipelineclassifier(this);
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadMessageNoVirtual<CoreML::Specification::PipelineClassifier>
                                  (input,value_16);
              }
              else if (uVar7 == 0xc9) {
                if (cVar6 != 'J') goto switchD_0018a2b6_caseD_25d;
                value_12 = mutable_pipelineregressor(this);
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadMessageNoVirtual<CoreML::Specification::PipelineRegressor>
                                  (input,value_12);
              }
              else if (uVar7 == 0xca) {
                if (cVar6 != 'R') goto switchD_0018a2b6_caseD_25d;
                value_11 = mutable_pipeline(this);
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadMessageNoVirtual<CoreML::Specification::Pipeline>(input,value_11);
              }
              else if (uVar7 == 500) {
                if (cVar6 != -0x5e) goto switchD_0018a2b6_caseD_25d;
                value_18 = mutable_neuralnetwork(this);
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadMessageNoVirtual<CoreML::Specification::NeuralNetwork>(input,value_18);
              }
              else if (uVar7 == 0x1f5) {
                if (cVar6 != -0x56) goto switchD_0018a2b6_caseD_25d;
                value_32 = mutable_itemsimilarityrecommender(this);
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadMessageNoVirtual<CoreML::Specification::ItemSimilarityRecommender>
                                  (input,value_32);
              }
              else if (uVar7 == 0x22b) {
                if (cVar6 != 'Z') goto switchD_0018a2b6_caseD_25d;
                value_23 = mutable_custommodel(this);
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadMessageNoVirtual<CoreML::Specification::CustomModel>(input,value_23);
              }
              else if (uVar7 == 0x22c) {
                if (cVar6 != 'b') goto switchD_0018a2b6_caseD_25d;
                value_26 = mutable_linkedmodel(this);
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadMessageNoVirtual<CoreML::Specification::LinkedModel>(input,value_26);
              }
              else if (uVar7 == 900) {
                if (cVar6 != '\"') goto switchD_0018a2b6_caseD_25d;
                value_30 = mutable_identity(this);
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadMessageNoVirtual<CoreML::Specification::Identity>(input,value_30);
              }
              else {
                if ((uVar7 != 1) || (cVar6 != '\b')) goto switchD_0018a2b6_caseD_25d;
                bVar4 = google::protobuf::internal::WireFormatLite::
                        ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                                  (input,&this->specificationversion_);
              }
            }
          }
        }
      }
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool Model::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Model)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(24002u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 specificationVersion = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &specificationversion_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ModelDescription description = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_description()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isUpdatable = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isupdatable_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PipelineClassifier pipelineClassifier = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipelineclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PipelineRegressor pipelineRegressor = 201;
      case 201: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1610u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipelineregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Pipeline pipeline = 202;
      case 202: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1618u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pipeline()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMRegressor glmRegressor = 300;
      case 300: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_glmregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SupportVectorRegressor supportVectorRegressor = 301;
      case 301: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2410u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_supportvectorregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleRegressor treeEnsembleRegressor = 302;
      case 302: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2418u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensembleregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkRegressor neuralNetworkRegressor = 303;
      case 303: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2426u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetworkregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BayesianProbitRegressor bayesianProbitRegressor = 304;
      case 304: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(2434u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bayesianprobitregressor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier glmClassifier = 400;
      case 400: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3202u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_glmclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SupportVectorClassifier supportVectorClassifier = 401;
      case 401: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3210u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_supportvectorclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleClassifier treeEnsembleClassifier = 402;
      case 402: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3218u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensembleclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkClassifier neuralNetworkClassifier = 403;
      case 403: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3226u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetworkclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.KNearestNeighborsClassifier kNearestNeighborsClassifier = 404;
      case 404: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(3234u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_knearestneighborsclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetwork neuralNetwork = 500;
      case 500: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_neuralnetwork()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ItemSimilarityRecommender itemSimilarityRecommender = 501;
      case 501: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_itemsimilarityrecommender()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CustomModel customModel = 555;
      case 555: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4442u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_custommodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LinkedModel linkedModel = 556;
      case 556: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4450u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linkedmodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.OneHotEncoder oneHotEncoder = 600;
      case 600: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_onehotencoder()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Imputer imputer = 601;
      case 601: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.FeatureVectorizer featureVectorizer = 602;
      case 602: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4818u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_featurevectorizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DictVectorizer dictVectorizer = 603;
      case 603: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4826u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dictvectorizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Scaler scaler = 604;
      case 604: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4834u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scaler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CategoricalMapping categoricalMapping = 606;
      case 606: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4850u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_categoricalmapping()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Normalizer normalizer = 607;
      case 607: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4858u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_normalizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureExtractor arrayFeatureExtractor = 609;
      case 609: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4874u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_arrayfeatureextractor()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NonMaximumSuppression nonMaximumSuppression = 610;
      case 610: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(4882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_nonmaximumsuppression()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Identity identity = 900;
      case 900: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7202u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_identity()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.TextClassifier textClassifier = 2000;
      case 2000: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_textclassifier()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.WordTagger wordTagger = 2001;
      case 2001: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_wordtagger()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.VisionFeaturePrint visionFeaturePrint = 2002;
      case 2002: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16018u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_visionfeatureprint()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing soundAnalysisPreprocessing = 2003;
      case 2003: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16026u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_soundanalysispreprocessing()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.Gazetteer gazetteer = 2004;
      case 2004: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16034u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_gazetteer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.WordEmbedding wordEmbedding = 2005;
      case 2005: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16042u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_wordembedding()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SerializedModel serializedModel = 3000;
      case 3000: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_serializedmodel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Model)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Model)
  return false;
#undef DO_
}